

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

QByteArray * __thiscall
QMakeEvaluator::getCommandOutput
          (QByteArray *__return_storage_ptr__,QMakeEvaluator *this,QString *args,int *exitCode)

{
  Data *pDVar1;
  int iVar2;
  char *__s;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_48 = 0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_48,(QObject *)0x0);
  runProcess(this,(QProcess *)&local_48,args);
  iVar2 = QProcess::exitStatus();
  if (iVar2 == 0) {
    iVar2 = QProcess::exitCode();
  }
  else {
    iVar2 = -1;
  }
  *exitCode = iVar2;
  local_68.size = -0x5555555555555556;
  local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QProcess::readAllStandardError();
  __s = local_68.ptr;
  if (local_68.ptr == (char *)0x0) {
    __s = (char *)&QByteArray::_empty;
  }
  fputs(__s,_stderr);
  QProcess::readAllStandardOutput();
  pDVar1 = local_88.d;
  local_88.d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = local_88.ptr;
  local_88.ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = local_88.size;
  local_88.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  QProcess::~QProcess((QProcess *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QMakeEvaluator::getCommandOutput(const QString &args, int *exitCode) const
{
    QByteArray out;
#if QT_CONFIG(process)
    QProcess proc;
    runProcess(&proc, args);
    *exitCode = (proc.exitStatus() == QProcess::NormalExit) ? proc.exitCode() : -1;
    QByteArray errout = proc.readAllStandardError();
# ifdef PROEVALUATOR_FULL
    // FIXME: Qt really should have the option to set forwarding per channel
    fputs(errout.constData(), stderr);
# else
    if (!errout.isEmpty()) {
        if (errout.endsWith('\n'))
            errout.chop(1);
        m_handler->message(
            QMakeHandler::EvalError | (m_cumulative ? QMakeHandler::CumulativeEvalMessage : 0),
            QString::fromLocal8Bit(errout));
    }
# endif
    out = proc.readAllStandardOutput();
# ifdef Q_OS_WIN
    // FIXME: Qt's line end conversion on sequential files should really be fixed
    out.replace("\r\n", "\n");
# endif
#else
    if (FILE *proc = QT_POPEN(QString(QLatin1String("cd ")
                               + IoUtils::shellQuote(QDir::toNativeSeparators(currentDirectory()))
                               + QLatin1String(" && ") + args).toLocal8Bit().constData(), QT_POPEN_READ)) {
        while (!feof(proc)) {
            char buff[10 * 1024];
            int read_in = int(fread(buff, 1, sizeof(buff), proc));
            if (!read_in)
                break;
            out += QByteArray(buff, read_in);
        }
        int ec = QT_PCLOSE(proc);
# ifdef Q_OS_WIN
        *exitCode = ec >= 0 ? ec : -1;
# else
        *exitCode = WIFEXITED(ec) ? WEXITSTATUS(ec) : -1;
# endif
    }
# ifdef Q_OS_WIN
    out.replace("\r\n", "\n");
# endif
#endif
    return out;
}